

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O3

time_point __thiscall absl::lts_20240722::ToChronoTime(lts_20240722 *this,Time t)

{
  time_point tVar1;
  Duration num;
  Duration DVar2;
  undefined1 auStack_10 [16];
  
  DVar2.rep_lo_ = t.rep_.rep_hi_.lo_;
  if (this == (lts_20240722 *)0x0) {
    this._0_4_ = 0;
    this._4_4_ = 0;
  }
  else if ((long)this < 0) {
    auStack_10._0_8_ = 0x10b640;
    DVar2.rep_hi_ = (HiRep)this;
    DVar2 = Floor(DVar2,(Duration)(ZEXT412(4) << 0x40));
    this = (lts_20240722 *)DVar2.rep_hi_;
  }
  if (DVar2.rep_lo_ != 0xffffffff) {
    if ((ulong)this >> 0x21 != 0) {
      num.rep_lo_ = DVar2.rep_lo_;
      num.rep_hi_ = (HiRep)this;
      tVar1.__d.__r =
           (duration)IDivDuration(num,(Duration)(ZEXT412(4) << 0x40),(Duration *)(auStack_10 + 4));
      return (time_point)tVar1.__d.__r;
    }
    return (time_point)((ulong)(DVar2.rep_lo_ >> 2) + (long)this * 1000000000);
  }
  tVar1.__d.__r = (duration)-0x8000000000000000;
  if (-1 < (long)this) {
    tVar1.__d.__r = (duration)0x7fffffffffffffff;
  }
  return (time_point)tVar1.__d.__r;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION constexpr bool operator<(Duration lhs,
                                                       Duration rhs) {
  return time_internal::GetRepHi(lhs) != time_internal::GetRepHi(rhs)
             ? time_internal::GetRepHi(lhs) < time_internal::GetRepHi(rhs)
         : time_internal::GetRepHi(lhs) == (std::numeric_limits<int64_t>::min)()
             ? time_internal::GetRepLo(lhs) + 1 <
                   time_internal::GetRepLo(rhs) + 1
             : time_internal::GetRepLo(lhs) < time_internal::GetRepLo(rhs);
}